

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_str_utf16be(archive_write *a,uchar *p,char *s,size_t l,uint16_t uf,vdc vdc)

{
  void *pvVar1;
  wchar_t wVar2;
  int iVar3;
  size_t n;
  int *piVar4;
  bool bVar5;
  short *local_60;
  uint16_t *u16;
  iso9660_conflict *iso9660;
  ulong uStack_48;
  int onepad;
  size_t i;
  size_t size;
  vdc vdc_local;
  uint16_t uf_local;
  size_t l_local;
  char *s_local;
  uchar *p_local;
  archive_write *a_local;
  
  l_local = (size_t)s;
  if (s == (char *)0x0) {
    l_local = (size_t)anon_var_dwarf_47608;
  }
  bVar5 = (l & 1) != 0;
  _vdc_local = l;
  if (bVar5) {
    _vdc_local = l & 0xfffffffffffffffe;
  }
  if (vdc == VDC_UCS2) {
    pvVar1 = a->format_data;
    n = strlen((char *)l_local);
    wVar2 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x48),(void *)l_local,n,
                              *(archive_string_conv **)((long)pvVar1 + 0x78));
    if ((wVar2 != L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for UTF-16BE");
      return -0x1e;
    }
    i = *(ulong *)((long)pvVar1 + 0x50);
    if (_vdc_local < i) {
      i = _vdc_local;
    }
    memcpy(p,*(void **)((long)pvVar1 + 0x48),i);
  }
  else {
    local_60 = (short *)l_local;
    i = 0;
    while (*local_60 != 0) {
      i = i + 2;
      local_60 = local_60 + 1;
    }
    if (_vdc_local < i) {
      i = _vdc_local;
    }
    memcpy(p,(void *)l_local,i);
  }
  s_local = (char *)p;
  for (uStack_48 = 0; uStack_48 < i; uStack_48 = uStack_48 + 2) {
    iVar3 = joliet_allowed_char(*s_local,s_local[1]);
    if (iVar3 == 0) {
      archive_be16enc(s_local,0x5f);
    }
    s_local = s_local + 2;
  }
  for (_vdc_local = _vdc_local - i; _vdc_local != 0; _vdc_local = _vdc_local + -2) {
    archive_be16enc(s_local,uf);
    s_local = s_local + 2;
  }
  if (bVar5) {
    *s_local = '\0';
  }
  return 0;
}

Assistant:

static int
set_str_utf16be(struct archive_write *a, unsigned char *p, const char *s,
    size_t l, uint16_t uf, enum vdc vdc)
{
	size_t size, i;
	int onepad;

	if (s == NULL)
		s = "\0\0";
	if (l & 0x01) {
		onepad = 1;
		l &= ~1;
	} else
		onepad = 0;
	if (vdc == VDC_UCS2) {
		struct iso9660 *iso9660 = a->format_data;
		if (archive_strncpy_l(&iso9660->utf16be, s, strlen(s),
		    iso9660->sconv_to_utf16be) != 0 && errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}
		size = iso9660->utf16be.length;
		if (size > l)
			size = l;
		memcpy(p, iso9660->utf16be.s, size);
	} else {
		const uint16_t *u16 = (const uint16_t *)s;

		size = 0;
		while (*u16++)
			size += 2;
		if (size > l)
			size = l;
		memcpy(p, s, size);
	}
	for (i = 0; i < size; i += 2, p += 2) {
		if (!joliet_allowed_char(p[0], p[1]))
			archive_be16enc(p, 0x005F);/* '_' */
	}
	l -= size;
	while (l > 0) {
		archive_be16enc(p, uf);
		p += 2;
		l -= 2;
	}
	if (onepad)
		*p = 0;
	return (ARCHIVE_OK);
}